

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadGeometry(ColladaParser *this,Mesh *pMesh)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string local_40;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    cVar1 = (char)iVar2;
    while (cVar1 != '\0') {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        if (iVar3 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"mesh");
        if (iVar2 == 0) {
          ReadMesh(this,pMesh);
        }
        else {
          SkipElement(this);
        }
      }
      else if (iVar3 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"geometry");
        if (iVar2 == 0) {
          return;
        }
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Expected end of <geometry> element.","");
        ThrowException(this,&local_40);
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      cVar1 = (char)iVar2;
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadGeometry(Collada::Mesh* pMesh)
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("mesh"))
            {
                // read on from there
                ReadMesh(pMesh);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "geometry") != 0)
                ThrowException("Expected end of <geometry> element.");

            break;
        }
    }
}